

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::
ImmutableStringOneofFieldLiteGenerator
          (ImmutableStringOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  OneofDescriptor *oneof;
  OneofGeneratorInfo *info;
  
  ImmutableStringFieldLiteGenerator::ImmutableStringFieldLiteGenerator
            (&this->super_ImmutableStringFieldLiteGenerator,descriptor,messageBitIndex,context);
  (this->super_ImmutableStringFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__ImmutableStringOneofFieldLiteGenerator_0168f570;
  oneof = FieldDescriptor::containing_oneof(descriptor);
  info = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables
            (descriptor,info,&(this->super_ImmutableStringFieldLiteGenerator).variables_);
  return;
}

Assistant:

ImmutableStringOneofFieldLiteGenerator::ImmutableStringOneofFieldLiteGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, Context* context)
    : ImmutableStringFieldLiteGenerator(descriptor, messageBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}